

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O0

void __thiscall llvm::raw_ostream::SetBuffered(raw_ostream *this)

{
  int iVar1;
  undefined4 extraout_var;
  size_t Size;
  raw_ostream *this_local;
  
  iVar1 = (*this->_vptr_raw_ostream[10])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    SetUnbuffered(this);
  }
  else {
    SetBufferSize(this,CONCAT44(extraout_var,iVar1));
  }
  return;
}

Assistant:

void raw_ostream::SetBuffered() {
  // Ask the subclass to determine an appropriate buffer size.
  if (size_t Size = preferred_buffer_size())
    SetBufferSize(Size);
  else
    // It may return 0, meaning this stream should be unbuffered.
    SetUnbuffered();
}